

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx2.cpp
# Opt level: O0

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx2::create_group_ops
          (ConvolutionDepthWise_x86_avx2 *this,Option *opt)

{
  ulong uVar1;
  Layer *pLVar2;
  int iVar3;
  size_type sVar4;
  reference ppLVar5;
  undefined8 in_RSI;
  long *in_RDI;
  Mat weight_data_int8_scales_g_1;
  Mat weights_1 [4];
  Mat weight_data_int8_scales_g;
  Mat weights [5];
  ParamDict pd;
  Layer *op;
  Mat bias_data_g;
  Mat weight_data_g;
  int g;
  int num_output_g;
  int channels_g;
  int i;
  int channels;
  int maxk;
  undefined4 in_stack_fffffffffffff958;
  int in_stack_fffffffffffff95c;
  Layer *in_stack_fffffffffffff960;
  undefined4 in_stack_fffffffffffff968;
  float in_stack_fffffffffffff96c;
  Mat *in_stack_fffffffffffff970;
  Mat *in_stack_fffffffffffff978;
  Mat *in_stack_fffffffffffff980;
  Mat *local_670;
  Mat *local_630;
  Mat *local_600;
  Mat *local_5c0;
  undefined1 local_590 [232];
  Mat local_4a8 [4];
  Mat aMStack_388 [3];
  Mat local_298 [5];
  undefined1 auStack_130 [24];
  Layer *local_118;
  Mat local_b8 [2];
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  undefined8 local_10;
  
  local_14 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) *
             *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
  uVar1 = (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x104) /
          (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108);
  local_18 = ((int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) /
                   (long)local_14) /
             (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) /
             *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108))) *
             *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108);
  local_10 = in_RSI;
  for (local_1c = 0; iVar3 = local_1c,
      sVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                        ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 2)),
      iVar3 < (int)sVar4; local_1c = local_1c + 1) {
    ppLVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 2),
                         (long)local_1c);
    if (*ppLVar5 != (value_type)0x0) {
      (*(*ppLVar5)->_vptr_Layer[1])();
    }
  }
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::clear
            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)0x62731c);
  local_20 = local_18 / *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108);
  local_24 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) /
             *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108);
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)in_stack_fffffffffffff980,
             (size_type)in_stack_fffffffffffff978);
  for (local_28 = 0; local_28 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108);
      local_28 = local_28 + 1) {
    ncnn::Mat::range((Mat *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
                     (int)((ulong)in_stack_fffffffffffff960 >> 0x20),(int)in_stack_fffffffffffff960)
    ;
    ncnn::Mat::Mat(local_b8);
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x100) != 0) {
      ncnn::Mat::range((Mat *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
                       (int)((ulong)in_stack_fffffffffffff960 >> 0x20),
                       (int)in_stack_fffffffffffff960);
      ncnn::Mat::operator=
                ((Mat *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
                 (Mat *)in_stack_fffffffffffff960);
      ncnn::Mat::~Mat((Mat *)0x62748c);
    }
    local_118 = create_layer((int)in_stack_fffffffffffff96c);
    ParamDict::ParamDict((ParamDict *)in_stack_fffffffffffff980);
    ParamDict::set((ParamDict *)(auStack_130 + 8),0,local_24);
    ParamDict::set((ParamDict *)(auStack_130 + 8),1,
                   *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4));
    ParamDict::set((ParamDict *)(auStack_130 + 8),0xb,
                   *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8));
    ParamDict::set((ParamDict *)(auStack_130 + 8),2,
                   *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc));
    ParamDict::set((ParamDict *)(auStack_130 + 8),0xc,
                   *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0));
    ParamDict::set((ParamDict *)(auStack_130 + 8),3,
                   *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4));
    ParamDict::set((ParamDict *)(auStack_130 + 8),0xd,
                   *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8));
    ParamDict::set((ParamDict *)(auStack_130 + 8),4,0);
    ParamDict::set((ParamDict *)(auStack_130 + 8),0xe,0);
    ParamDict::set((ParamDict *)(auStack_130 + 8),5,
                   *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x100));
    ParamDict::set((ParamDict *)(auStack_130 + 8),6,local_14 * local_20 * local_24);
    ParamDict::set((ParamDict *)(auStack_130 + 8),8,
                   *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x10c));
    ParamDict::set((ParamDict *)(auStack_130 + 8),9,
                   *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x110));
    ParamDict::set((ParamDict *)in_stack_fffffffffffff960,in_stack_fffffffffffff95c,(Mat *)0x62772f)
    ;
    (*local_118->_vptr_Layer[2])(local_118,auStack_130 + 8);
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x100) == 0) {
      local_630 = local_4a8;
      do {
        ncnn::Mat::Mat(local_630);
        local_630 = local_630 + 1;
      } while (local_630 != aMStack_388);
      ncnn::Mat::operator=
                ((Mat *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
                 (Mat *)in_stack_fffffffffffff960);
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x10c) != 0) {
        ncnn::Mat::Mat(in_stack_fffffffffffff970,(int)in_stack_fffffffffffff96c,
                       (size_t)in_stack_fffffffffffff960,
                       (Allocator *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
        ncnn::Mat::operator[]
                  ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8),(long)local_28);
        ncnn::Mat::fill(in_stack_fffffffffffff970,in_stack_fffffffffffff96c);
        ncnn::Mat::operator=
                  ((Mat *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
                   (Mat *)in_stack_fffffffffffff960);
        ncnn::Mat::range((Mat *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
                         (int)((ulong)in_stack_fffffffffffff960 >> 0x20),
                         (int)in_stack_fffffffffffff960);
        ncnn::Mat::operator=
                  ((Mat *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
                   (Mat *)in_stack_fffffffffffff960);
        ncnn::Mat::~Mat((Mat *)0x627ce8);
        ncnn::Mat::~Mat((Mat *)0x627cf5);
      }
      if (100 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x10c)) {
        ncnn::Mat::range((Mat *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
                         (int)((ulong)in_stack_fffffffffffff960 >> 0x20),
                         (int)in_stack_fffffffffffff960);
        ncnn::Mat::operator=
                  ((Mat *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
                   (Mat *)in_stack_fffffffffffff960);
        ncnn::Mat::~Mat((Mat *)0x627e1d);
      }
      pLVar2 = local_118;
      ModelBinFromMatArray::ModelBinFromMatArray
                ((ModelBinFromMatArray *)in_stack_fffffffffffff980,in_stack_fffffffffffff978);
      (*pLVar2->_vptr_Layer[3])(pLVar2,local_590);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)in_stack_fffffffffffff960)
      ;
      local_670 = aMStack_388;
      do {
        in_stack_fffffffffffff980 = local_670 + -1;
        ncnn::Mat::~Mat((Mat *)0x627eb9);
        local_670 = in_stack_fffffffffffff980;
      } while (in_stack_fffffffffffff980 != local_4a8);
    }
    else {
      local_5c0 = local_298;
      do {
        ncnn::Mat::Mat(local_5c0);
        local_5c0 = local_5c0 + 1;
      } while (local_5c0 != (Mat *)auStack_130);
      ncnn::Mat::operator=
                ((Mat *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
                 (Mat *)in_stack_fffffffffffff960);
      ncnn::Mat::operator=
                ((Mat *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
                 (Mat *)in_stack_fffffffffffff960);
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x10c) != 0) {
        ncnn::Mat::Mat(in_stack_fffffffffffff970,(int)in_stack_fffffffffffff96c,
                       (size_t)in_stack_fffffffffffff960,
                       (Allocator *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
        ncnn::Mat::operator[]
                  ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8),(long)local_28);
        ncnn::Mat::fill(in_stack_fffffffffffff970,in_stack_fffffffffffff96c);
        ncnn::Mat::operator=
                  ((Mat *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
                   (Mat *)in_stack_fffffffffffff960);
        ncnn::Mat::range((Mat *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
                         (int)((ulong)in_stack_fffffffffffff960 >> 0x20),
                         (int)in_stack_fffffffffffff960);
        ncnn::Mat::operator=
                  ((Mat *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
                   (Mat *)in_stack_fffffffffffff960);
        ncnn::Mat::~Mat((Mat *)0x6278eb);
        ncnn::Mat::~Mat((Mat *)0x6278f8);
      }
      if (100 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x10c)) {
        ncnn::Mat::range((Mat *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
                         (int)((ulong)in_stack_fffffffffffff960 >> 0x20),
                         (int)in_stack_fffffffffffff960);
        ncnn::Mat::operator=
                  ((Mat *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
                   (Mat *)in_stack_fffffffffffff960);
        ncnn::Mat::~Mat((Mat *)0x627a51);
      }
      pLVar2 = local_118;
      ModelBinFromMatArray::ModelBinFromMatArray
                ((ModelBinFromMatArray *)in_stack_fffffffffffff980,in_stack_fffffffffffff978);
      (*pLVar2->_vptr_Layer[3])(pLVar2,&aMStack_388[0].refcount);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)in_stack_fffffffffffff960)
      ;
      local_600 = (Mat *)auStack_130;
      do {
        local_600 = local_600 + -1;
        ncnn::Mat::~Mat((Mat *)0x627aff);
      } while (local_600 != local_298);
    }
    (*local_118->_vptr_Layer[4])(local_118,local_10);
    in_stack_fffffffffffff960 = local_118;
    ppLVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 2),
                         (long)local_28);
    *ppLVar5 = in_stack_fffffffffffff960;
    ParamDict::~ParamDict((ParamDict *)in_stack_fffffffffffff960);
    ncnn::Mat::~Mat((Mat *)0x627f97);
    ncnn::Mat::~Mat((Mat *)0x627fa4);
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86_avx2::create_group_ops(const Option& opt)
{
    // create Convolution op for each group
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    for (int i = 0; i < (int)group_ops.size(); i++)
        delete group_ops[i];

    group_ops.clear();

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    group_ops.resize(group);

    for (int g = 0; g < group; g++)
    {
        Mat weight_data_g = weight_data.range(maxk * channels_g * num_output_g * g, maxk * channels_g * num_output_g);
        Mat bias_data_g;
        if (bias_term)
            bias_data_g = bias_data.range(num_output_g * g, num_output_g);

        ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output_g); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, dilation_w);
        pd.set(12, dilation_h);
        pd.set(3, stride_w);
        pd.set(13, stride_h);
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, maxk * channels_g * num_output_g); // weight_data_size
        pd.set(8, int8_scale_term);
        pd.set(9, activation_type);
        pd.set(10, activation_params);

        op->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[5];
            weights[0] = weight_data_g;
            weights[1] = bias_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[2] = weight_data_int8_scales_g;
                weights[3] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[4] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[4];
            weights[0] = weight_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[1] = weight_data_int8_scales_g;
                weights[2] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[3] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }

        op->create_pipeline(opt);

        group_ops[g] = op;
    }

    return 0;
}